

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  UdpTools *this;
  int iVar1;
  char *pcVar2;
  allocator<char> local_f1;
  string message;
  string port;
  string ifaceName;
  string sendAddress;
  string local_70;
  string local_50;
  string local_30;
  
  if (argc < 3) {
    printf("\nUsage: %s <address> <port>\n\nExample: %s ff02::5:6 12345\n\n",*argv);
    return 1;
  }
  if (argc - 5U < 0xfffffffe) {
    puts("Usage: send address port. Example send ff02::5:6 12345");
    puts(
        "Usage (need be root): send iface-name address port. Example sudo send eth0 ff02::5:6 12345"
        );
    return -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sendAddress,argv[1],(allocator<char> *)&port);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&port,argv[2],(allocator<char> *)&ifaceName);
  ifaceName._M_dataplus._M_p = (pointer)&ifaceName.field_2;
  ifaceName._M_string_length = 0;
  ifaceName.field_2._M_local_buf[0] = '\0';
  pcVar2 = argv[1];
  if (argc == 3) {
    if ((pcVar2 == (char *)0x0) || (argv[2] == (char *)0x0)) {
      pcVar2 = "Usage: listen address port. Example receive ff02::5:6 12345";
LAB_0010263c:
      puts(pcVar2);
      iVar1 = -1;
      goto LAB_00102644;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&message,pcVar2,&local_f1);
    std::__cxx11::string::operator=((string *)&sendAddress,(string *)&message);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::string<std::allocator<char>>((string *)&message,argv[2],&local_f1);
    std::__cxx11::string::operator=((string *)&port,(string *)&message);
    std::__cxx11::string::~string((string *)&message);
    this = (UdpTools *)operator_new(0x30);
    UdpTools::UdpTools(this);
  }
  else {
    if (((pcVar2 == (char *)0x0) || (argv[2] == (char *)0x0)) || (argv[3] == (char *)0x0)) {
      pcVar2 = "Usage: listen iface-name address port. Example receive eth0 ff02::5:6 12345";
      goto LAB_0010263c;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&message,pcVar2,&local_f1);
    std::__cxx11::string::operator=((string *)&ifaceName,(string *)&message);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::string<std::allocator<char>>((string *)&message,argv[2],&local_f1);
    std::__cxx11::string::operator=((string *)&sendAddress,(string *)&message);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::string<std::allocator<char>>((string *)&message,argv[3],&local_f1);
    std::__cxx11::string::operator=((string *)&port,(string *)&message);
    std::__cxx11::string::~string((string *)&message);
    this = (UdpTools *)operator_new(0x30);
    std::__cxx11::string::string((string *)&local_30,(string *)&ifaceName);
    UdpTools::UdpTools(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&message,"AreYouThere?",&local_f1);
  std::__cxx11::string::string((string *)&local_50,(string *)&sendAddress);
  std::__cxx11::string::string((string *)&local_70,(string *)&port);
  UdpTools::SendUDPDatagram
            (this,true,&local_50,&local_70,message._M_dataplus._M_p,(int)message._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&message);
  iVar1 = 0;
LAB_00102644:
  std::__cxx11::string::~string((string *)&ifaceName);
  std::__cxx11::string::~string((string *)&port);
  std::__cxx11::string::~string((string *)&sendAddress);
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc < 3) {
		printf("\nUsage: %s <address> <port>\n\nExample: %s ff02::5:6 12345\n\n", argv[0], argv[0]);
		return 1;
	}

	if(argc != 3 && argc != 4)
	{
		printf("Usage: send address port. Example send ff02::5:6 12345\n");
		printf("Usage (need be root): send iface-name address port. Example sudo send eth0 ff02::5:6 12345\n");
		return -1;
	}

	std::string sendAddress = std::string(argv[1]);
	std::string port = std::string(argv[2]);
	std::string ifaceName;
	UdpTools* p_udpSender;

	if(argc == 3)
	{
		if(argv[1] == NULL || argv[2] == NULL)
		{
			printf("Usage: listen address port. Example receive ff02::5:6 12345\n");
			return -1;
		}
		sendAddress = std::string(argv[1]);
		port = std::string(argv[2]);
		p_udpSender = new UdpTools();

	}

	if(argc == 4)
	{
		if(argv[1] == NULL || argv[2] == NULL || argv[3] == NULL)
		{
			printf("Usage: listen iface-name address port. Example receive eth0 ff02::5:6 12345\n");
			return -1;
		}
		ifaceName = std::string(argv[1]);
		sendAddress = std::string(argv[2]);
		port = std::string(argv[3]);
		p_udpSender = new UdpTools(ifaceName);
	}

	std::string message = "AreYouThere?";
	p_udpSender->SendUDPDatagram(true, sendAddress, port, message.c_str(), message.length());

}